

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setData
          (Texture *this,ConstPixelBufferAccess *src,int width,int height,deUint32 internalFormat,
          bool useMipmap)

{
  int iVar1;
  int iVar2;
  deUint32 target;
  TransferFormat TVar3;
  uint uVar4;
  uint uVar5;
  int face;
  int iVar6;
  CubeFace face_00;
  int level;
  undefined7 in_register_00000089;
  int iVar7;
  
  TVar3 = glu::getTransferFormat(src->m_format);
  if ((int)CONCAT71(in_register_00000089,useMipmap) == 0) {
    iVar1 = 1;
  }
  else {
    uVar5 = height;
    if (height < width) {
      uVar5 = width;
    }
    uVar4 = 0x20;
    if (uVar5 != 0) {
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    iVar1 = 0x20 - uVar4;
  }
  this->m_numMipLevels = iVar1;
  this->m_internalFormat = internalFormat;
  iVar1 = tcu::TextureFormat::getPixelSize(&src->m_format);
  this->m_dataSizeApprox =
       ((uint)(this->m_type == TEXTURETYPE_CUBE) * 5 + 1) * iVar1 * height * width;
  iVar1 = computePixelStore(&src->m_format);
  glwPixelStorei(0xcf5,iVar1);
  if (this->m_type == TEXTURETYPE_CUBE) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0x8513,this->m_textureGL);
    for (iVar1 = 0; iVar1 < this->m_numMipLevels; iVar1 = iVar1 + 1) {
      iVar6 = width >> ((byte)iVar1 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      iVar7 = height >> ((byte)iVar1 & 0x1f);
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      iVar2 = tcu::TextureFormat::getPixelSize(&src->m_format);
      this->m_dataSizeApprox = this->m_dataSizeApprox + iVar2 * iVar6 * iVar7 * 6;
      for (face_00 = CUBEFACE_NEGATIVE_X; face_00 != CUBEFACE_LAST;
          face_00 = face_00 + CUBEFACE_POSITIVE_X) {
        target = cubeFaceToGLFace(face_00);
        glwTexImage2D(target,iVar1,internalFormat,iVar6,iVar7,0,TVar3.format,TVar3.dataType,
                      src->m_data);
      }
    }
  }
  else if (this->m_type == TEXTURETYPE_2D) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0xde1,this->m_textureGL);
    for (iVar1 = 0; iVar1 < this->m_numMipLevels; iVar1 = iVar1 + 1) {
      iVar6 = width >> ((byte)iVar1 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      iVar7 = height >> ((byte)iVar1 & 0x1f);
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      iVar2 = tcu::TextureFormat::getPixelSize(&src->m_format);
      this->m_dataSizeApprox = this->m_dataSizeApprox + iVar2 * iVar6 * iVar7;
      glwTexImage2D(0xde1,iVar1,internalFormat,iVar6,iVar7,0,TVar3.format,TVar3.dataType,src->m_data
                   );
    }
  }
  return;
}

Assistant:

void Texture::setData (const ConstPixelBufferAccess& src, const int width, const int height, const deUint32 internalFormat, const bool useMipmap)
{
	DE_ASSERT(m_type != TEXTURETYPE_CUBE || width == height);
	DE_ASSERT(!useMipmap || (deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height)));

	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	m_numMipLevels = useMipmap ? deLog2Floor32(de::max(width, height))+1 : 1;

	m_internalFormat = internalFormat;
	m_dataSizeApprox = width * height * format.getPixelSize() * (m_type == TEXTURETYPE_CUBE ? 6 : 1);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += levelWid * levelHei * format.getPixelSize();
			glTexImage2D(GL_TEXTURE_2D, level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += 6 * levelWid * levelHei * format.getPixelSize();
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexImage2D(cubeFaceToGLFace((CubeFace)face), level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}